

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool inja::Renderer::truthy(json *data)

{
  value_t vVar1;
  array_t *paVar2;
  bool bVar3;
  bool ret;
  boolean_t local_9;
  
  vVar1 = (data->m_data).m_type;
  if (vVar1 == boolean) {
    local_9 = false;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (data,&local_9);
  }
  else {
    if ((byte)(vVar1 - number_integer) < 3) {
      bVar3 = nlohmann::json_abi_v3_11_3::operator!=<int,_0>(data,0);
      return bVar3;
    }
    local_9 = false;
    if (vVar1 != null) {
      if (vVar1 == object) {
        local_9 = (((data->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                  _M_node_count == 0;
      }
      else if (vVar1 == array) {
        paVar2 = (data->m_data).m_value.array;
        local_9 = (paVar2->
                  super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (paVar2->
                  super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      return (bool)(local_9 ^ 1);
    }
  }
  return local_9;
}

Assistant:

constexpr bool is_boolean() const noexcept
    {
        return m_data.m_type == value_t::boolean;
    }